

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O1

int Abc_TtCheckDsdAnd(word t,int i,int j,word *pOut)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if ((5 < (uint)i) || (5 < (uint)j)) {
    __assert_fail("iVar >= 0 && iVar < 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                  ,0x240,"word Abc_Tt6Cofactor0(word, int)");
  }
  bVar2 = (byte)(1 << ((byte)i & 0x1f));
  uVar7 = (t & s_Truths6Neg[(uint)i]) << (bVar2 & 0x3f) | t & s_Truths6Neg[(uint)i];
  uVar6 = uVar7 & s_Truths6Neg[(uint)j];
  bVar3 = (byte)(1 << ((byte)j & 0x1f));
  uVar7 = uVar7 & s_Truths6[(uint)j];
  uVar5 = (s_Truths6[(uint)i] & t) >> (bVar2 & 0x3f) | s_Truths6[(uint)i] & t;
  uVar8 = s_Truths6Neg[(uint)j] & uVar5;
  uVar6 = uVar6 << (bVar3 & 0x3f) | uVar6;
  uVar5 = uVar5 & s_Truths6[(uint)j];
  uVar7 = uVar7 >> (bVar3 & 0x3f) | uVar7;
  uVar8 = uVar8 << (bVar3 & 0x3f) | uVar8;
  uVar5 = uVar5 >> (bVar3 & 0x3f) | uVar5;
  if ((uVar6 == uVar7) && (uVar6 == uVar8)) {
    iVar1 = 0;
    uVar4 = uVar6;
    uVar8 = uVar5;
  }
  else {
    uVar4 = uVar5;
    if ((uVar5 == uVar6) && (uVar5 == uVar8)) {
      iVar1 = 1;
      uVar8 = uVar7;
    }
    else if ((uVar5 == uVar6) && (uVar5 == uVar7)) {
      iVar1 = 2;
    }
    else if ((uVar5 == uVar7) && (uVar5 == uVar8)) {
      iVar1 = 3;
      uVar8 = uVar6;
    }
    else {
      if (uVar5 != uVar6) {
        return -1;
      }
      if (uVar7 != uVar8) {
        return -1;
      }
      iVar1 = 4;
    }
  }
  if (pOut != (word *)0x0) {
    *pOut = (uVar8 ^ uVar4) & s_Truths6[(uint)i] ^ uVar4;
  }
  return iVar1;
}

Assistant:

static inline int Abc_TtCheckDsdAnd( word t, int i, int j, word * pOut )
{
    word c0 = Abc_Tt6Cofactor0( t, i );
    word c1 = Abc_Tt6Cofactor1( t, i );
    word c00 = Abc_Tt6Cofactor0( c0, j );
    word c01 = Abc_Tt6Cofactor1( c0, j );
    word c10 = Abc_Tt6Cofactor0( c1, j );
    word c11 = Abc_Tt6Cofactor1( c1, j );
    if ( c00 == c01 && c00 == c10 ) //  i *  j
    {
        if ( pOut ) *pOut = (~s_Truths6[i] & c00) | (s_Truths6[i] & c11);
        return 0;
    }
    if ( c11 == c00 && c11 == c10 ) //  i * !j
    {
        if ( pOut ) *pOut = (~s_Truths6[i] & c11) | (s_Truths6[i] & c01);
        return 1;
    }
    if ( c11 == c00 && c11 == c01 ) // !i *  j
    {
        if ( pOut ) *pOut = (~s_Truths6[i] & c11) | (s_Truths6[i] & c10);
        return 2;
    }
    if ( c11 == c01 && c11 == c10 ) // !i * !j
    {
        if ( pOut ) *pOut = (~s_Truths6[i] & c11) | (s_Truths6[i] & c00);
        return 3;
    }
    if ( c00 == c11 && c01 == c10 )
    {
        if ( pOut ) *pOut = (~s_Truths6[i] & c11) | (s_Truths6[i] & c10);
        return 4;
    }
    return -1;
}